

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

RuneStrLite cppjieba::DecodeRuneInString(char *str,size_t len)

{
  RuneStrLite RVar1;
  ulong in_RSI;
  byte *in_RDI;
  RuneStrLite rp;
  RuneStrLite local_8;
  
  RuneStrLite::RuneStrLite(&local_8,0,0);
  if ((in_RDI != (byte *)0x0) && (in_RSI != 0)) {
    if (((int)(char)*in_RDI & 0x80U) == 0) {
      local_8.rune = *in_RDI & 0x7f;
      local_8.len = 1;
    }
    else if ((*in_RDI < 0xe0) && (1 < in_RSI)) {
      local_8.rune = in_RDI[1] & 0x3f | (*in_RDI & 0x1f) << 6;
      local_8.len = 2;
    }
    else if ((*in_RDI < 0xf0) && (2 < in_RSI)) {
      local_8.rune = in_RDI[2] & 0x3f | (in_RDI[1] & 0x3f | (*in_RDI & 0xf) << 6) << 6;
      local_8.len = 3;
    }
    else if ((*in_RDI < 0xf8) && (3 < in_RSI)) {
      local_8.rune = in_RDI[3] & 0x3f |
                     (in_RDI[2] & 0x3f | (in_RDI[1] & 0x3f | (*in_RDI & 7) << 6) << 6) << 6;
      local_8.len = 4;
    }
    else {
      local_8.rune = 0;
      local_8.len = 0;
    }
  }
  RVar1.len = local_8.len;
  RVar1.rune = local_8.rune;
  return RVar1;
}

Assistant:

inline RuneStrLite DecodeRuneInString(const char* str, size_t len) {
  RuneStrLite rp(0, 0);
  if (str == NULL || len == 0) {
    return rp;
  }
  if (!(str[0] & 0x80)) { // 0xxxxxxx
    // 7bit, total 7bit
    rp.rune = (uint8_t)(str[0]) & 0x7f;
    rp.len = 1;
  } else if ((uint8_t)str[0] <= 0xdf &&  1 < len) { 
    // 110xxxxxx
    // 5bit, total 5bit
    rp.rune = (uint8_t)(str[0]) & 0x1f;

    // 6bit, total 11bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;
    rp.len = 2;
  } else if((uint8_t)str[0] <= 0xef && 2 < len) { // 1110xxxxxx
    // 4bit, total 4bit
    rp.rune = (uint8_t)(str[0]) & 0x0f;

    // 6bit, total 10bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;

    // 6bit, total 16bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[2]) & 0x3f;

    rp.len = 3;
  } else if((uint8_t)str[0] <= 0xf7 && 3 < len) { // 11110xxxx
    // 3bit, total 3bit
    rp.rune = (uint8_t)(str[0]) & 0x07;

    // 6bit, total 9bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[1]) & 0x3f;

    // 6bit, total 15bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[2]) & 0x3f;

    // 6bit, total 21bit
    rp.rune <<= 6;
    rp.rune |= (uint8_t)(str[3]) & 0x3f;

    rp.len = 4;
  } else {
    rp.rune = 0;
    rp.len = 0;
  }
  return rp;
}